

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_thunder.c
# Opt level: O1

int ThunderDecodeRow(TIFF *tif,uint8_t *buf,tmsize_t occ,uint16_t s)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  ulong uVar6;
  
  if (occ % tif->tif_scanlinesize == 0) {
    iVar3 = 1;
    if (0 < occ) {
      do {
        uVar6 = (ulong)(tif->tif_dir).td_imagewidth;
        lVar1 = tif->tif_rawcc;
        if (0 < lVar1 && uVar6 != 0) {
          iVar3 = (*(code *)(&DAT_003370c0 +
                            *(int *)(&DAT_003370c0 + (ulong)(*tif->tif_rawcp >> 6) * 4)))(lVar1,buf)
          ;
          return iVar3;
        }
        tif->tif_rawcp = tif->tif_rawcp;
        tif->tif_rawcc = lVar1;
        if (uVar6 != 0) {
          pcVar5 = "Too much";
          if (uVar6 != 0) {
            pcVar5 = "Not enough";
          }
          TIFFErrorExtR(tif,"ThunderDecode","%s data at scanline %lu (%lu != %lu)",pcVar5,
                        (ulong)tif->tif_row,0,uVar6);
          return 0;
        }
        lVar1 = tif->tif_scanlinesize;
        buf = buf + lVar1;
        lVar4 = occ - lVar1;
        bVar2 = lVar1 <= occ;
        occ = lVar4;
      } while (lVar4 != 0 && bVar2);
      iVar3 = 1;
    }
  }
  else {
    iVar3 = 0;
    TIFFErrorExtR(tif,"ThunderDecodeRow","Fractional scanlines cannot be read");
  }
  return iVar3;
}

Assistant:

static int ThunderDecodeRow(TIFF *tif, uint8_t *buf, tmsize_t occ, uint16_t s)
{
    static const char module[] = "ThunderDecodeRow";
    uint8_t *row = buf;

    (void)s;
    if (occ % tif->tif_scanlinesize)
    {
        TIFFErrorExtR(tif, module, "Fractional scanlines cannot be read");
        return (0);
    }
    while (occ > 0)
    {
        if (!ThunderDecode(tif, row, tif->tif_dir.td_imagewidth))
            return (0);
        occ -= tif->tif_scanlinesize;
        row += tif->tif_scanlinesize;
    }
    return (1);
}